

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

size_t drwav_read_raw(drwav *pWav,size_t bytesToRead,void *pBufferOut)

{
  long in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  size_t bytesRead;
  ulong local_18;
  size_t local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_8 = 0;
  }
  else {
    local_18 = in_RSI;
    if ((ulong)in_RDI[0xe] < in_RSI) {
      local_18 = in_RDI[0xe];
    }
    local_8 = (*(code *)*in_RDI)(in_RDI[3],in_RDX,local_18);
    in_RDI[0xe] = in_RDI[0xe] - local_8;
  }
  return local_8;
}

Assistant:

size_t drwav_read_raw(drwav* pWav, size_t bytesToRead, void* pBufferOut)
{
    if (pWav == NULL || bytesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    if (bytesToRead > pWav->bytesRemaining) {
        bytesToRead = (size_t)pWav->bytesRemaining;
    }

    size_t bytesRead = pWav->onRead(pWav->pUserData, pBufferOut, bytesToRead);

    pWav->bytesRemaining -= bytesRead;
    return bytesRead;
}